

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
project::get_module_list_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,project *this)

{
  const_iterator pxVar1;
  const_iterator pxVar2;
  char_t *pcVar3;
  xpath_node node;
  xpath_node_set set;
  allocator local_99;
  xml_node local_98;
  xml_attribute local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  xpath_node local_68;
  xpath_node_set local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pugi::xml_node::select_nodes
            (&local_58,(xml_node *)this,"/JUCERPROJECT/MODULES/MODULE",(xpath_variable_set *)0x0);
  pxVar1 = pugi::xpath_node_set::begin(&local_58);
  while( true ) {
    pxVar2 = pugi::xpath_node_set::end(&local_58);
    if (pxVar1 == pxVar2) break;
    local_68._node._root = (pxVar1->_node)._root;
    local_68._attribute._attr = (pxVar1->_attribute)._attr;
    local_98 = pugi::xpath_node::node(&local_68);
    local_90 = pugi::xml_node::attribute(&local_98,"id");
    pcVar3 = pugi::xml_attribute::value(&local_90);
    std::__cxx11::string::string((string *)&local_88,pcVar3,&local_99);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pxVar1 = pxVar1 + 1;
  }
  pugi::xpath_node_set::~xpath_node_set(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> project::get_module_list()
{
    std::vector<std::string> res;

    pugi::xpath_node_set set = m_Doc.select_nodes("/JUCERPROJECT/MODULES/MODULE");
    for (pugi::xpath_node_set::const_iterator it = set.begin(); it != set.end(); ++it)
    {
        pugi::xpath_node node = *it;
        res.push_back(node.node().attribute("id").value());
    }

    return res;
}